

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.hpp
# Opt level: O1

void duckdb::ParquetDecodeUtils::Skip
               (ByteBuffer *src,bitpacking_width_t *bitpack_pos,idx_t count,bitpacking_width_t width
               )

{
  idx_t iVar1;
  byte bVar2;
  undefined7 in_register_00000009;
  ulong uVar3;
  idx_t iVar4;
  
  uVar3 = CONCAT71(in_register_00000009,width) & 0xffffffff;
  CheckWidth(width);
  ByteBuffer::available(src,(uVar3 * count) / 8);
  iVar4 = count;
  if ((0x1f < count) && (*bitpack_pos == '\0')) {
    iVar4 = (idx_t)((uint)count & 0x1f);
    SkipAligned(src,count & 0xffffffffffffffe0,width);
  }
  if (iVar4 != 0) {
    iVar1 = 0;
    do {
      bVar2 = *bitpack_pos + (char)uVar3;
      while (*bitpack_pos = bVar2, 8 < bVar2) {
        src->len = src->len - 1;
        src->ptr = src->ptr + 1;
        bVar2 = *bitpack_pos - 8;
      }
      iVar1 = iVar1 + 1;
    } while (iVar1 != iVar4);
  }
  return;
}

Assistant:

static void Skip(ByteBuffer &src, bitpacking_width_t &bitpack_pos, idx_t count, const bitpacking_width_t width) {
		CheckWidth(width);
		src.available(count * width / BITPACK_DLEN); // check if buffer has enough space available once
		if (bitpack_pos == 0 && count >= BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE) {
			idx_t remainder = count % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;
			idx_t aligned_count = count - remainder;
			SkipAligned(src, aligned_count, width);
			count = remainder;
		}
		// FIXME: we should be able to just do this in one go instead of having this loop
		for (idx_t i = 0; i < count; i++) {
			bitpack_pos += width;
			while (bitpack_pos > BITPACK_DLEN) {
				src.unsafe_inc(1);
				bitpack_pos -= BITPACK_DLEN;
			}
		}
	}